

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,bool reuse_addr,type_conflict1 param_4)

{
  service_type *psVar1;
  implementation_type *piVar2;
  boolean<1,_2> local_64;
  int local_60;
  int local_4c;
  undefined1 local_48 [4];
  protocol_type protocol;
  error_code ec;
  type_conflict1 param_4_local;
  bool reuse_addr_local;
  endpoint_type *endpoint_local;
  io_context *context_local;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this_local;
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  std::error_code::error_code((error_code *)local_48);
  local_4c = (int)ip::basic_endpoint<asio::ip::tcp>::protocol(endpoint);
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  local_60 = detail::reactive_socket_service<asio::ip::tcp>::open
                       (psVar1,(char *)piVar2,(int)&local_4c,local_48);
  detail::throw_error((error_code *)local_48,"open");
  if (reuse_addr) {
    psVar1 = detail::
             io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             ::get_service(&this->impl_);
    piVar2 = detail::
             io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             ::get_implementation(&this->impl_);
    detail::socket_option::boolean<1,_2>::boolean(&local_64,true);
    detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              (psVar1,piVar2,&local_64,(error_code *)local_48);
    detail::throw_error((error_code *)local_48,"set_option");
  }
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  detail::reactive_socket_service<asio::ip::tcp>::bind
            (psVar1,(int)piVar2,(sockaddr *)endpoint,(socklen_t)local_48);
  detail::throw_error((error_code *)local_48,"bind");
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  detail::reactive_socket_service_base::listen
            (&psVar1->super_reactive_socket_service_base,(int)piVar2,0x1000);
  detail::throw_error((error_code *)local_48,"listen");
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const endpoint_type& endpoint, bool reuse_addr = true,
      typename constraint<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    if (reuse_addr)
    {
      impl_.get_service().set_option(impl_.get_implementation(),
          socket_base::reuse_address(true), ec);
      asio::detail::throw_error(ec, "set_option");
    }
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
    impl_.get_service().listen(impl_.get_implementation(),
        socket_base::max_listen_connections, ec);
    asio::detail::throw_error(ec, "listen");
  }